

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitting.hpp
# Opt level: O2

pair<eos::core::Mesh,_eos::fitting::RenderingParameters> *
eos::fitting::fit_shape_and_pose
          (pair<eos::core::Mesh,_eos::fitting::RenderingParameters> *__return_storage_ptr__,
          MorphableModel *morphable_model,LandmarkCollection<Eigen::Vector2f> *landmarks,
          LandmarkMapper *landmark_mapper,int image_width,int image_height,
          EdgeTopology *edge_topology,ContourLandmarks *contour_landmarks,
          ModelContour *model_contour,int num_iterations,optional<int> num_shape_coefficients_to_fit
          ,float lambda_identity,optional<int> num_expression_coefficients_to_fit,
          optional<float> lambda_expressions,
          vector<float,_std::allocator<float>_> *pca_shape_coefficients,
          vector<float,_std::allocator<float>_> *expression_coefficients,
          vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
          *fitted_image_points)

{
  PcaModel *color_instance;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *tvi;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *tci;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *texture_coordinates;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *texture_triangle_indices;
  optional<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
  *this;
  int iVar1;
  pointer pfVar2;
  pointer pfVar3;
  pointer pLVar4;
  float *__ptr;
  Index IVar5;
  pointer piVar6;
  _Storage<int,_true> yaw_angle;
  variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>
  *pvVar7;
  runtime_error *this_00;
  ModelContour *vec_b;
  RenderingParameters *rendering_parameters;
  int *piVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  VectorXf current_pca_shape;
  float *local_658;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  image_points;
  vector<int,_std::allocator<int>_> vertex_indices;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  occluding_contour_landmarks;
  VectorXf mean_plus_expressions;
  VectorXf current_combined_shape;
  vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  model_points;
  void *local_588 [2];
  optional<int> vertex_idx;
  __normal_iterator<const_eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_*,_std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>
  _Stack_570;
  float local_568;
  float fStack_564;
  pointer pMStack_560;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  ScaledOrthoProjectionParameters current_pose;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  image_points_contour;
  vector<int,_std::allocator<int>_> vertex_indices_contour;
  RenderingParameters rendering_params;
  DenseStorage<float,__1,__1,_1,_0> local_408;
  vector<int,_std::allocator<int>_> fixed_vertex_indices;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  fixed_image_points;
  _Vector_base<float,_std::allocator<float>_> local_3c8;
  _Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  local_3b0;
  _Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  local_398;
  _Vector_base<float,_std::allocator<float>_> local_380;
  pair<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::vector<int,_std::allocator<int>_>_>
  edge_correspondences;
  _Vector_base<float,_std::allocator<float>_> local_318;
  _Vector_base<float,_std::allocator<float>_> local_300;
  _Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  local_2e8;
  _Vector_base<float,_std::allocator<float>_> local_2d0;
  ScaledOrthoProjectionParameters local_2b8;
  Matrix<float,_3,_4,_0,_3,_4> affine_from_ortho_1;
  Matrix<float,_3,_4,_0,_3,_4> local_248;
  _Vector_base<float,_std::allocator<float>_> local_218;
  _Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  local_200;
  Mesh current_mesh;
  string local_158;
  _Optional_payload_base<int> local_138;
  Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *pLStack_130;
  Matrix<float,_3,_4,_0,_3,_4> affine_from_ortho;
  ScaledOrthoProjectionParameters local_b8;
  RenderingParameters local_88;
  
  if ((ulong)(((long)(landmarks->
                     super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
              (long)(landmarks->
                    super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start) / 0x28) < 4) {
    __assert_fail("landmarks.size() >= 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/fitting.hpp"
                  ,0x104,
                  "std::pair<core::Mesh, fitting::RenderingParameters> eos::fitting::fit_shape_and_pose(const morphablemodel::MorphableModel &, const core::LandmarkCollection<Eigen::Vector2f> &, const core::LandmarkMapper &, int, int, const morphablemodel::EdgeTopology &, const fitting::ContourLandmarks &, const fitting::ModelContour &, int, cpp17::optional<int>, float, cpp17::optional<int>, cpp17::optional<float>, std::vector<float> &, std::vector<float> &, std::vector<Eigen::Vector2f> &)"
                 );
  }
  if ((image_width < 1) || (image_height < 1)) {
    __assert_fail("image_width > 0 && image_height > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/fitting.hpp"
                  ,0x105,
                  "std::pair<core::Mesh, fitting::RenderingParameters> eos::fitting::fit_shape_and_pose(const morphablemodel::MorphableModel &, const core::LandmarkCollection<Eigen::Vector2f> &, const core::LandmarkMapper &, int, int, const morphablemodel::EdgeTopology &, const fitting::ContourLandmarks &, const fitting::ModelContour &, int, cpp17::optional<int>, float, cpp17::optional<int>, cpp17::optional<float>, std::vector<float> &, std::vector<float> &, std::vector<Eigen::Vector2f> &)"
                 );
  }
  if (num_iterations < 1) {
    __assert_fail("num_iterations > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/fitting.hpp"
                  ,0x106,
                  "std::pair<core::Mesh, fitting::RenderingParameters> eos::fitting::fit_shape_and_pose(const morphablemodel::MorphableModel &, const core::LandmarkCollection<Eigen::Vector2f> &, const core::LandmarkMapper &, int, int, const morphablemodel::EdgeTopology &, const fitting::ContourLandmarks &, const fitting::ModelContour &, int, cpp17::optional<int>, float, cpp17::optional<int>, cpp17::optional<float>, std::vector<float> &, std::vector<float> &, std::vector<Eigen::Vector2f> &)"
                 );
  }
  pfVar2 = (pca_shape_coefficients->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pfVar3 = (pca_shape_coefficients->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar12 = (morphable_model->shape_model).rescaled_pca_basis.
           super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
  if ((ulong)(long)(int)uVar12 < (ulong)((long)pfVar3 - (long)pfVar2 >> 2)) {
    __assert_fail("pca_shape_coefficients.size() <= morphable_model.get_shape_model().get_num_principal_components()"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/fitting.hpp"
                  ,0x107,
                  "std::pair<core::Mesh, fitting::RenderingParameters> eos::fitting::fit_shape_and_pose(const morphablemodel::MorphableModel &, const core::LandmarkCollection<Eigen::Vector2f> &, const core::LandmarkMapper &, int, int, const morphablemodel::EdgeTopology &, const fitting::ContourLandmarks &, const fitting::ModelContour &, int, cpp17::optional<int>, float, cpp17::optional<int>, cpp17::optional<float>, std::vector<float> &, std::vector<float> &, std::vector<Eigen::Vector2f> &)"
                 );
  }
  uVar11 = (ulong)num_shape_coefficients_to_fit.super__Optional_base<int,_true,_true>._M_payload.
                  super__Optional_payload_base<int> >> 0x20;
  if ((uVar11 & 1) == 0) {
    uVar11 = 1;
    local_658 = (float *)0x0;
  }
  else {
    if ((int)uVar12 <
        num_shape_coefficients_to_fit.super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int>._M_payload) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,
                 "Specified more shape coefficients to fit than the given shape model contains.");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_658 = (float *)((ulong)num_shape_coefficients_to_fit.super__Optional_base<int,_true,_true>
                                 ._M_payload.super__Optional_payload_base<int> & 0xffffff0000000000)
    ;
    uVar12 = (ulong)num_shape_coefficients_to_fit.super__Optional_base<int,_true,_true>._M_payload.
                    super__Optional_payload_base<int> & 0xffffffff;
  }
  if (pfVar2 == pfVar3) {
    if ((uVar11 & 1) == 0) {
      std::__throw_bad_optional_access();
    }
    std::vector<float,_std::allocator<float>_>::resize(pca_shape_coefficients,(long)(int)uVar12);
  }
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_2d0,pca_shape_coefficients);
  morphablemodel::PcaModel::draw_sample
            ((PcaModel *)&current_pca_shape,(vector<float,_std::allocator<float>_> *)morphable_model
            );
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_2d0);
  if ((morphable_model->expression_model).
      super__Optional_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
      ._M_engaged == false) {
    __assert_fail("morphable_model.has_separate_expression_model()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/fitting.hpp"
                  ,300,
                  "std::pair<core::Mesh, fitting::RenderingParameters> eos::fitting::fit_shape_and_pose(const morphablemodel::MorphableModel &, const core::LandmarkCollection<Eigen::Vector2f> &, const core::LandmarkMapper &, int, int, const morphablemodel::EdgeTopology &, const fitting::ContourLandmarks &, const fitting::ModelContour &, int, cpp17::optional<int>, float, cpp17::optional<int>, cpp17::optional<float>, std::vector<float> &, std::vector<float> &, std::vector<Eigen::Vector2f> &)"
                 );
  }
  this = &morphable_model->expression_model;
  pvVar7 = std::
           optional<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
           ::value(this);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_380,expression_coefficients);
  morphablemodel::draw_sample
            ((morphablemodel *)&vertex_idx,pvVar7,
             (vector<float,_std::allocator<float>_> *)&local_380);
  Eigen::MatrixBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator+
            ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
              *)&current_mesh,(MatrixBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&current_pca_shape,
             (MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)&vertex_idx);
  Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::Matrix<float,_1,1,0,_1,1>const,Eigen::Matrix<float,_1,1,0,_1,1>const>>
            ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&current_combined_shape,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
              *)&current_mesh);
  free((void *)vertex_idx.super__Optional_base<int,_true,_true>._M_payload.
               super__Optional_payload_base<int>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_380);
  color_instance = &morphable_model->color_model;
  tvi = &(morphable_model->shape_model).triangle_list;
  tci = &(morphable_model->color_model).triangle_list;
  texture_coordinates = &morphable_model->texture_coordinates;
  texture_triangle_indices = &morphable_model->texture_triangle_indices;
  morphablemodel::sample_to_mesh
            (&current_mesh,&current_combined_shape,&color_instance->mean,tvi,tci,texture_coordinates
             ,texture_triangle_indices);
  model_points.
  super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  model_points.
  super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  model_points.
  super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vertex_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  image_points.
  super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vertex_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vertex_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  image_points.
  super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  image_points.
  super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar13 = 0;
  uVar9 = 0;
  do {
    pLVar4 = (landmarks->
             super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(landmarks->
                       super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pLVar4) / 0x28) <= uVar9)
    {
      std::
      vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
      ::vector((vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                *)&local_398,&image_points);
      std::
      vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
      ::vector((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                *)&local_3b0,&model_points);
      estimate_orthographic_projection_linear
                (&current_pose,
                 (vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                  *)&local_398,
                 (vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                  *)&local_3b0,true,(optional<int>)((ulong)(uint)image_height | 0x100000000));
      std::
      _Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
      ::~_Vector_base(&local_3b0);
      std::
      _Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
      ::~_Vector_base(&local_398);
      local_b8.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = current_pose.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
            m_data.array[0];
      local_b8.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [1] = current_pose.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
            m_data.array[1];
      local_b8.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] = current_pose.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
            m_data.array[2];
      local_b8.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [3] = current_pose.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
            m_data.array[3];
      local_b8.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [4] = current_pose.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
            m_data.array[4];
      local_b8.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [5] = current_pose.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
            m_data.array[5];
      local_b8.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [6] = current_pose.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
            m_data.array[6];
      local_b8.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [7] = current_pose.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
            m_data.array[7];
      local_b8.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [8] = current_pose.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
            m_data.array[8];
      local_b8.tx = current_pose.tx;
      local_b8.ty = current_pose.ty;
      local_b8.s = current_pose.s;
      RenderingParameters::RenderingParameters(&rendering_params,&local_b8,image_width,image_height)
      ;
      local_88.camera_type = rendering_params.camera_type;
      local_88.frustum.l = rendering_params.frustum.l;
      local_88.frustum.r = rendering_params.frustum.r;
      local_88.frustum.b = rendering_params.frustum.b;
      local_88.frustum.t = rendering_params.frustum.t;
      local_88.rotation.m_coeffs.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
      m_storage.m_data.array[0] =
           rendering_params.rotation.m_coeffs.
           super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0];
      local_88.rotation.m_coeffs.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
      m_storage.m_data.array[1] =
           rendering_params.rotation.m_coeffs.
           super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1];
      local_88.rotation.m_coeffs.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
      m_storage.m_data.array[2] =
           rendering_params.rotation.m_coeffs.
           super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2];
      local_88.rotation.m_coeffs.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
      m_storage.m_data.array[3] =
           rendering_params.rotation.m_coeffs.
           super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3];
      local_88.t_x = rendering_params.t_x;
      local_88.t_y = rendering_params.t_y;
      local_88.t_z.super__Optional_base<float,_true,_true>._M_payload.
      super__Optional_payload_base<float> =
           rendering_params.t_z.super__Optional_base<float,_true,_true>._M_payload.
           super__Optional_payload_base<float>;
      local_88.fov_y.super__Optional_base<float,_true,_true>._M_payload.
      super__Optional_payload_base<float> =
           rendering_params.fov_y.super__Optional_base<float,_true,_true>._M_payload.
           super__Optional_payload_base<float>;
      local_88.screen_width = rendering_params.screen_width;
      local_88.screen_height = rendering_params.screen_height;
      get_3x4_affine_camera_matrix(&affine_from_ortho,&local_88,image_width,image_height);
      pvVar7 = std::
               optional<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
               ::value(this);
      fit_expressions((vector<float,_std::allocator<float>_> *)&vertex_idx,pvVar7,&current_pca_shape
                      ,&affine_from_ortho,&image_points,&vertex_indices,lambda_expressions,
                      num_expression_coefficients_to_fit);
      std::vector<float,_std::allocator<float>_>::_M_move_assign
                (expression_coefficients,(_Vector_base<float,_std::allocator<float>_> *)&vertex_idx)
      ;
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&vertex_idx);
      pvVar7 = std::
               optional<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
               ::value(this);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&local_3c8,expression_coefficients);
      morphablemodel::draw_sample
                ((morphablemodel *)&edge_correspondences,pvVar7,
                 (vector<float,_std::allocator<float>_> *)&local_3c8);
      Eigen::MatrixBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator+
                ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
                  *)&vertex_idx,(MatrixBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&current_pca_shape,
                 (MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)&edge_correspondences);
      Eigen::internal::
      call_assignment<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::Matrix<float,_1,1,0,_1,1>const,Eigen::Matrix<float,_1,1,0,_1,1>const>>
                (&current_combined_shape,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
                  *)&vertex_idx);
      free(edge_correspondences.first.
           super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_3c8);
      morphablemodel::sample_to_mesh
                ((Mesh *)&vertex_idx,&current_combined_shape,&color_instance->mean,tvi,tci,
                 texture_coordinates,texture_triangle_indices);
      core::Mesh::operator=(&current_mesh,(Mesh *)&vertex_idx);
      core::Mesh::~Mesh((Mesh *)&vertex_idx);
      std::
      vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
      ::vector(&fixed_image_points,&image_points);
      std::vector<int,_std::allocator<int>_>::vector(&fixed_vertex_indices,&vertex_indices);
      for (iVar10 = 0; iVar10 != num_iterations; iVar10 = iVar10 + 1) {
        std::
        vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ::operator=(&image_points,&fixed_image_points);
        std::vector<int,_std::allocator<int>_>::operator=(&vertex_indices,&fixed_vertex_indices);
        image_points_contour.
        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        image_points_contour.
        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        image_points_contour.
        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vertex_indices_contour.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        vertex_indices_contour.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        vertex_indices_contour.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        RenderingParameters::get_yaw_pitch_roll((RenderingParameters *)&vertex_idx);
        yaw_angle._M_value =
             vertex_idx.super__Optional_base<int,_true,_true>._M_payload.
             super__Optional_payload_base<int>._M_payload._M_value;
        RenderingParameters::get_modelview((Matrix4f *)&edge_correspondences,&rendering_params);
        RenderingParameters::get_projection((Matrix4f *)&affine_from_ortho_1,&rendering_params);
        mean_plus_expressions.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
        m_storage.m_data._0_4_ = 0;
        vec_b = model_contour;
        mean_plus_expressions.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
        m_storage.m_data._4_4_ = (float)image_height;
        mean_plus_expressions.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
        m_storage.m_rows._0_4_ = (float)image_width;
        mean_plus_expressions.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
        m_storage.m_rows._4_4_ = (float)-image_height;
        get_contour_correspondences
                  ((tuple<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::vector<int,_std::allocator<int>_>_>
                    *)&vertex_idx,landmarks,contour_landmarks,model_contour,(float)yaw_angle,
                   &current_mesh,(Matrix4f *)&edge_correspondences,(Matrix4f *)&affine_from_ortho_1,
                   (Vector4f *)&mean_plus_expressions,7.5);
        occluding_contour_landmarks.
        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)&std::ignore;
        occluding_contour_landmarks.
        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&image_points_contour;
        occluding_contour_landmarks.
        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)&vertex_indices_contour;
        std::
        _Tuple_impl<0ul,std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>&,std::_Swallow_assign_const&,std::vector<int,std::allocator<int>>&>
        ::
        _M_assign<std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>,std::vector<Eigen::Matrix<float,4,1,0,4,1>,std::allocator<Eigen::Matrix<float,4,1,0,4,1>>>,std::vector<int,std::allocator<int>>>
                  ((_Tuple_impl<0ul,std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>&,std::_Swallow_assign_const&,std::vector<int,std::allocator<int>>&>
                    *)&occluding_contour_landmarks,
                   (_Tuple_impl<0UL,_std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::vector<int,_std::allocator<int>_>_>
                    *)&vertex_idx);
        std::
        _Tuple_impl<0UL,_std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::vector<int,_std::allocator<int>_>_>
        ::~_Tuple_impl((_Tuple_impl<0UL,_std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::vector<int,_std::allocator<int>_>_>
                        *)&vertex_idx);
        concat<int>((vector<int,_std::allocator<int>_> *)&vertex_idx,&vertex_indices,
                    &vertex_indices_contour);
        std::vector<int,_std::allocator<int>_>::_M_move_assign
                  (&vertex_indices,
                   (_Tuple_impl<0UL,_std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::vector<int,_std::allocator<int>_>_>
                    *)&vertex_idx);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&vertex_idx);
        concat<Eigen::Matrix<float,2,1,0,2,1>>
                  ((vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                    *)&vertex_idx,(fitting *)&image_points,&image_points_contour,
                   (vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                    *)vec_b);
        std::
        vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ::_M_move_assign(&image_points,
                         (_Tuple_impl<0UL,_std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::vector<int,_std::allocator<int>_>_>
                          *)&vertex_idx);
        std::
        _Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ::~_Vector_base((_Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                         *)&vertex_idx);
        occluding_contour_landmarks.
        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        occluding_contour_landmarks.
        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        occluding_contour_landmarks.
        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        if (0.0 <= (float)yaw_angle) {
          core::filter<Eigen::Matrix<float,2,1,0,2,1>>
                    ((LandmarkCollection<Eigen::Matrix<float,_2,_1>_> *)&vertex_idx,
                     (core *)landmarks,
                     (LandmarkCollection<Eigen::Matrix<float,_2,_1>_> *)
                     &contour_landmarks->left_contour,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)vec_b);
          std::
          for_each<__gnu_cxx::__normal_iterator<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>const*,std::vector<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>,std::allocator<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>>>>,eos::fitting::fit_shape_and_pose(eos::morphablemodel::MorphableModel_const&,std::vector<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>,std::allocator<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>>>const&,eos::core::LandmarkMapper_const&,int,int,eos::morphablemodel::EdgeTopology_const&,eos::fitting::ContourLandmarks_const&,eos::fitting::ModelContour_const&,int,std::optional<int>,float,std::optional<int>,std::optional<float>,std::vector<float,std::allocator<float>>&,std::vector<float,std::allocator<float>>&,std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>&)::_lambda(auto:1_const&)_1_>
                    ((__normal_iterator<const_eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_*,_std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>
                      )vertex_idx.super__Optional_base<int,_true,_true>._M_payload.
                       super__Optional_payload_base<int>,_Stack_570,&occluding_contour_landmarks);
        }
        else {
          core::filter<Eigen::Matrix<float,2,1,0,2,1>>
                    ((LandmarkCollection<Eigen::Matrix<float,_2,_1>_> *)&vertex_idx,
                     (core *)landmarks,
                     (LandmarkCollection<Eigen::Matrix<float,_2,_1>_> *)contour_landmarks,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)vec_b);
          std::
          for_each<__gnu_cxx::__normal_iterator<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>const*,std::vector<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>,std::allocator<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>>>>,eos::fitting::fit_shape_and_pose(eos::morphablemodel::MorphableModel_const&,std::vector<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>,std::allocator<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>>>const&,eos::core::LandmarkMapper_const&,int,int,eos::morphablemodel::EdgeTopology_const&,eos::fitting::ContourLandmarks_const&,eos::fitting::ModelContour_const&,int,std::optional<int>,float,std::optional<int>,std::optional<float>,std::vector<float,std::allocator<float>>&,std::vector<float,std::allocator<float>>&,std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>&)::_lambda(auto:1_const&)_2_>
                    ((__normal_iterator<const_eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_*,_std::vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>_>
                      )vertex_idx.super__Optional_base<int,_true,_true>._M_payload.
                       super__Optional_payload_base<int>,_Stack_570,&occluding_contour_landmarks);
        }
        std::
        vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
        ::~vector((vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                   *)&vertex_idx);
        rendering_parameters = &rendering_params;
        find_occluding_edge_correspondences
                  (&edge_correspondences,&current_mesh,edge_topology,rendering_parameters,
                   &occluding_contour_landmarks,180.0,true);
        concat<Eigen::Matrix<float,2,1,0,2,1>>
                  ((vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                    *)&vertex_idx,(fitting *)&image_points,&edge_correspondences.first,
                   (vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                    *)rendering_parameters);
        std::
        vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ::_M_move_assign(&image_points,
                         (_Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                          *)&vertex_idx);
        std::
        _Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ::~_Vector_base((_Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                         *)&vertex_idx);
        concat<int>((vector<int,_std::allocator<int>_> *)&vertex_idx,&vertex_indices,
                    &edge_correspondences.second);
        std::vector<int,_std::allocator<int>_>::_M_move_assign
                  (&vertex_indices,
                   (_Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                    *)&vertex_idx);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&vertex_idx);
        piVar6 = vertex_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        piVar8 = vertex_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (model_points.
            super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            model_points.
            super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          model_points.
          super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               model_points.
               super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        }
        for (; piVar8 != piVar6; piVar8 = piVar8 + 1) {
          iVar1 = *piVar8;
          vertex_idx.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._4_4_ =
               current_mesh.vertices.
               super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar1].
               super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
          ;
          vertex_idx.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_payload._M_value =
               ((_Storage<int,_true> *)
               (current_mesh.vertices.
                super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start + iVar1))->_M_value;
          _Stack_570._M_current._4_4_ = 0x3f800000;
          _Stack_570._M_current._0_4_ =
               current_mesh.vertices.
               super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar1].
               super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
          ;
          std::vector<Eigen::Matrix<float,4,1,0,4,1>,std::allocator<Eigen::Matrix<float,4,1,0,4,1>>>
          ::emplace_back<Eigen::Matrix<float,4,1,0,4,1>>
                    ((vector<Eigen::Matrix<float,4,1,0,4,1>,std::allocator<Eigen::Matrix<float,4,1,0,4,1>>>
                      *)&model_points,(Matrix<float,_4,_1,_0,_4,_1> *)&vertex_idx);
        }
        std::
        vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ::vector((vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                  *)&local_2e8,&image_points);
        std::
        vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
        ::vector((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                  *)&local_200,&model_points);
        estimate_orthographic_projection_linear
                  ((ScaledOrthoProjectionParameters *)&vertex_idx,
                   (vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                    *)&local_2e8,
                   (vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                    *)&local_200,true,(optional<int>)((ulong)(uint)image_height | 0x100000000));
        current_pose.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8] = local_558;
        current_pose.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[5] = fStack_564;
        current_pose.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[4] = local_568;
        current_pose.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array._24_8_ = pMStack_560;
        current_pose.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array._0_8_ = vertex_idx.super__Optional_base<int,_true,_true>._M_payload.
                      super__Optional_payload_base<int>;
        current_pose.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array._8_8_ = _Stack_570._M_current;
        current_pose.s = fStack_54c;
        current_pose.ty = fStack_550;
        current_pose.tx = fStack_554;
        std::
        _Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
        ::~_Vector_base(&local_200);
        std::
        _Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ::~_Vector_base(&local_2e8);
        local_2b8.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8] = current_pose.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[8];
        local_2b8.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[4] = current_pose.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[4];
        local_2b8.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[5] = current_pose.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[5];
        local_2b8.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6] = current_pose.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[6];
        local_2b8.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7] = current_pose.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[7];
        local_2b8.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] = current_pose.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[0];
        local_2b8.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] = current_pose.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[1];
        local_2b8.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] = current_pose.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[2];
        local_2b8.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[3] = current_pose.R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[3];
        local_2b8.s = current_pose.s;
        local_2b8.tx = current_pose.tx;
        local_2b8.ty = current_pose.ty;
        RenderingParameters::RenderingParameters
                  ((RenderingParameters *)&vertex_idx,&local_2b8,image_width,image_height);
        rendering_params._0_8_ =
             vertex_idx.super__Optional_base<int,_true,_true>._M_payload.
             super__Optional_payload_base<int>;
        rendering_params.frustum._4_8_ = _Stack_570._M_current;
        local_138 = (_Optional_payload_base<int>)
                    vertex_idx.super__Optional_base<int,_true,_true>._M_payload.
                    super__Optional_payload_base<int>;
        pLStack_130 = _Stack_570._M_current;
        get_3x4_affine_camera_matrix
                  (&affine_from_ortho_1,(RenderingParameters *)&local_138,image_width,image_height);
        pvVar7 = std::
                 optional<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
                 ::value(this);
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)&local_300,expression_coefficients);
        morphablemodel::draw_sample
                  ((morphablemodel *)local_588,pvVar7,
                   (vector<float,_std::allocator<float>_> *)&local_300);
        Eigen::MatrixBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator+
                  ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
                    *)&vertex_idx,(MatrixBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)morphable_model,
                   (MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)local_588);
        Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::Matrix<float,_1,1,0,_1,1>const,Eigen::Matrix<float,_1,1,0,_1,1>const>>
                  ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&mean_plus_expressions,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                    *)&vertex_idx);
        free(local_588[0]);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_300);
        local_248.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [0] = affine_from_ortho_1.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.
              m_storage.m_data.array[0];
        local_248.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [1] = affine_from_ortho_1.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.
              m_storage.m_data.array[1];
        local_248.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [2] = affine_from_ortho_1.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.
              m_storage.m_data.array[2];
        local_248.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [3] = affine_from_ortho_1.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.
              m_storage.m_data.array[3];
        local_248.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [4] = affine_from_ortho_1.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.
              m_storage.m_data.array[4];
        local_248.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [5] = affine_from_ortho_1.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.
              m_storage.m_data.array[5];
        local_248.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [6] = affine_from_ortho_1.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.
              m_storage.m_data.array[6];
        local_248.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [7] = affine_from_ortho_1.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.
              m_storage.m_data.array[7];
        local_248.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [8] = affine_from_ortho_1.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.
              m_storage.m_data.array[8];
        local_248.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [9] = affine_from_ortho_1.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.
              m_storage.m_data.array[9];
        local_248.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [10] = affine_from_ortho_1.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.
               m_storage.m_data.array[10];
        local_248.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [0xb] = affine_from_ortho_1.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.
                m_storage.m_data.array[0xb];
        Eigen::DenseStorage<float,_-1,_-1,_1,_0>::DenseStorage
                  (&local_408,(DenseStorage<float,__1,__1,_1,_0> *)&mean_plus_expressions);
        fit_shape_to_landmarks_linear
                  ((vector<float,_std::allocator<float>_> *)&vertex_idx,
                   &morphable_model->shape_model,&local_248,&image_points,&vertex_indices,
                   (VectorXf *)&local_408,lambda_identity,
                   (optional<int>)((ulong)local_658 | uVar12 & 0xffffffff | (uVar11 & 0xff) << 0x20)
                   ,(optional<float>)0x0,(optional<float>)0x0);
        std::vector<float,_std::allocator<float>_>::_M_move_assign
                  (pca_shape_coefficients,(PcaModel *)&vertex_idx);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  ((_Vector_base<float,_std::allocator<float>_> *)&vertex_idx);
        free(local_408.m_data);
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)&local_218,pca_shape_coefficients);
        morphablemodel::PcaModel::draw_sample
                  ((PcaModel *)&vertex_idx,(vector<float,_std::allocator<float>_> *)morphable_model)
        ;
        IVar5 = current_pca_shape.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows;
        __ptr = current_pca_shape.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                m_storage.m_data;
        current_pca_shape.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
        m_data = (float *)vertex_idx.super__Optional_base<int,_true,_true>._M_payload.
                          super__Optional_payload_base<int>;
        current_pca_shape.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows = (Index)_Stack_570._M_current;
        vertex_idx.super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int> =
             (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)__ptr;
        _Stack_570._M_current = (Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *)IVar5;
        free(__ptr);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_218);
        pvVar7 = std::
                 optional<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
                 ::value(this);
        fit_expressions((vector<float,_std::allocator<float>_> *)&vertex_idx,pvVar7,
                        &current_pca_shape,&affine_from_ortho_1,&image_points,&vertex_indices,
                        lambda_expressions,num_expression_coefficients_to_fit);
        std::vector<float,_std::allocator<float>_>::_M_move_assign
                  (expression_coefficients,
                   (_Vector_base<float,_std::allocator<float>_> *)&vertex_idx);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  ((_Vector_base<float,_std::allocator<float>_> *)&vertex_idx);
        pvVar7 = std::
                 optional<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>
                 ::value(this);
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)&local_318,expression_coefficients);
        morphablemodel::draw_sample
                  ((morphablemodel *)local_588,pvVar7,
                   (vector<float,_std::allocator<float>_> *)&local_318);
        Eigen::MatrixBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator+
                  ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
                    *)&vertex_idx,(MatrixBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&current_pca_shape
                   ,(MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)local_588);
        Eigen::internal::
        call_assignment<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::Matrix<float,_1,1,0,_1,1>const,Eigen::Matrix<float,_1,1,0,_1,1>const>>
                  (&current_combined_shape,
                   (CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
                    *)&vertex_idx);
        free(local_588[0]);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_318);
        morphablemodel::sample_to_mesh
                  ((Mesh *)&vertex_idx,&current_combined_shape,&color_instance->mean,tvi,tci,
                   texture_coordinates,texture_triangle_indices);
        core::Mesh::operator=(&current_mesh,(Mesh *)&vertex_idx);
        core::Mesh::~Mesh((Mesh *)&vertex_idx);
        free((void *)CONCAT44(mean_plus_expressions.
                              super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data._4_4_,
                              mean_plus_expressions.
                              super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data._0_4_));
        std::
        pair<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::vector<int,_std::allocator<int>_>_>
        ::~pair(&edge_correspondences);
        std::
        _Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ::~_Vector_base(&occluding_contour_landmarks.
                         super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                       );
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&vertex_indices_contour.super__Vector_base<int,_std::allocator<int>_>);
        std::
        _Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ::~_Vector_base(&image_points_contour.
                         super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                       );
      }
      std::
      vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
      ::operator=(fitted_image_points,&image_points);
      std::pair<eos::core::Mesh,_eos::fitting::RenderingParameters>::
      pair<eos::core::Mesh_&,_eos::fitting::RenderingParameters_&,_true>
                (__return_storage_ptr__,&current_mesh,&rendering_params);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&fixed_vertex_indices.super__Vector_base<int,_std::allocator<int>_>);
      std::
      _Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
      ::~_Vector_base(&fixed_image_points.
                       super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                     );
      std::
      _Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
      ::~_Vector_base(&image_points.
                       super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                     );
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&vertex_indices.super__Vector_base<int,_std::allocator<int>_>);
      std::
      _Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
      ::~_Vector_base(&model_points.
                       super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                     );
      core::Mesh::~Mesh(&current_mesh);
      free(current_combined_shape.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      free(current_pca_shape.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage
           .m_data);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string
              ((string *)&local_158,
               (string *)
               ((long)&(((Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *)
                        (&pLVar4->coordinates + -4))->name)._M_dataplus + lVar13));
    vertex_idx = core::get_vertex_index
                           (&local_158,landmark_mapper,&morphable_model->landmark_definitions);
    std::__cxx11::string::~string((string *)&local_158);
    if (vertex_idx.super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int>._M_engaged != false) {
      rendering_params._0_8_ =
           current_mesh.vertices.
           super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start +
           vertex_idx.super__Optional_base<int,_true,_true>._M_payload.
           super__Optional_payload_base<int>._M_payload._M_value;
      std::vector<Eigen::Matrix<float,4,1,0,4,1>,std::allocator<Eigen::Matrix<float,4,1,0,4,1>>>::
      emplace_back<Eigen::Homogeneous<Eigen::Matrix<float,3,1,0,3,1>,0>>
                ((vector<Eigen::Matrix<float,4,1,0,4,1>,std::allocator<Eigen::Matrix<float,4,1,0,4,1>>>
                  *)&model_points,
                 (Homogeneous<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0> *)&rendering_params);
      if (vertex_idx.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged == false) {
        std::__throw_bad_optional_access();
      }
      std::vector<int,std::allocator<int>>::emplace_back<int_const&>
                ((vector<int,std::allocator<int>> *)&vertex_indices,(int *)&vertex_idx);
      std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>::
      emplace_back<Eigen::Matrix<float,2,1,0,2,1>const&>
                ((vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>
                  *)&image_points,
                 (Matrix<float,_2,_1,_0,_2,_1> *)
                 ((long)&(((landmarks->
                           super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->coordinates).
                         super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage +
                 lVar13));
    }
    uVar9 = uVar9 + 1;
    lVar13 = lVar13 + 0x28;
  } while( true );
}

Assistant:

inline std::pair<core::Mesh, fitting::RenderingParameters> fit_shape_and_pose(
    const morphablemodel::MorphableModel& morphable_model,
    const core::LandmarkCollection<Eigen::Vector2f>& landmarks, const core::LandmarkMapper& landmark_mapper,
    int image_width, int image_height, const morphablemodel::EdgeTopology& edge_topology,
    const fitting::ContourLandmarks& contour_landmarks, const fitting::ModelContour& model_contour,
    int num_iterations, cpp17::optional<int> num_shape_coefficients_to_fit, float lambda_identity,
    cpp17::optional<int> num_expression_coefficients_to_fit, cpp17::optional<float> lambda_expressions,
    std::vector<float>& pca_shape_coefficients, std::vector<float>& expression_coefficients,
    std::vector<Eigen::Vector2f>& fitted_image_points)
{
    // assert(blendshapes.size() > 0);
    assert(landmarks.size() >= 4);
    assert(image_width > 0 && image_height > 0);
    assert(num_iterations > 0); // Can we allow 0, for only the initial pose-fit?
    assert(pca_shape_coefficients.size() <= morphable_model.get_shape_model().get_num_principal_components());
    // More asserts I forgot?
    if (num_shape_coefficients_to_fit)
    {
        if (num_shape_coefficients_to_fit.value() >
            morphable_model.get_shape_model().get_num_principal_components())
        {
            throw std::runtime_error(
                "Specified more shape coefficients to fit than the given shape model contains.");
        }
    }

    using Eigen::MatrixXf;
    using Eigen::Vector2f;
    using Eigen::Vector4f;
    using Eigen::VectorXf;
    using std::vector;

    if (!num_shape_coefficients_to_fit)
    {
        num_shape_coefficients_to_fit = morphable_model.get_shape_model().get_num_principal_components();
    }

    if (pca_shape_coefficients.empty())
    {
        pca_shape_coefficients.resize(num_shape_coefficients_to_fit.value());
    }
    // Todo: This leaves the following case open: num_coeffs given is empty or defined, but the
    // pca_shape_coefficients given is != num_coeffs or the model's max-coeffs. What to do then? Handle & document!

    /*if (expression_coefficients.empty())
    {
        expression_coefficients.resize(blendshapes.size());
    }*/

    // Current mesh - either from the given coefficients, or the mean:
    VectorXf current_pca_shape = morphable_model.get_shape_model().draw_sample(pca_shape_coefficients);
    assert(morphable_model.has_separate_expression_model()); // Note: We could also just skip the expression fitting in this case.
    // Note we don't check whether the shape and expression model dimensions match.
    // Note: We're calling this in a loop, and morphablemodel::to_matrix(expression_blendshapes) now gets
    // called again in every fitting iteration.
    VectorXf current_combined_shape =
        current_pca_shape +
        draw_sample(morphable_model.get_expression_model().value(), expression_coefficients);
    auto current_mesh = morphablemodel::sample_to_mesh(
        current_combined_shape, morphable_model.get_color_model().get_mean(),
        morphable_model.get_shape_model().get_triangle_list(),
        morphable_model.get_color_model().get_triangle_list(), morphable_model.get_texture_coordinates(),
        morphable_model.get_texture_triangle_indices());

    // The 2D and 3D point correspondences used for the fitting:
    vector<Vector4f> model_points; // the points in the 3D shape model
    vector<int> vertex_indices; // their vertex indices
    vector<Vector2f> image_points; // the corresponding 2D landmark points

    // Sub-select all the landmarks which we have a mapping for (i.e. that are defined in the 3DMM),
    // and get the corresponding model points (mean if given no initial coeffs, from the computed shape otherwise):
    for (int i = 0; i < landmarks.size(); ++i)
    {
        const cpp17::optional<int> vertex_idx = core::get_vertex_index(
            landmarks[i].name, landmark_mapper, morphable_model.get_landmark_definitions());
        if (!vertex_idx) // vertex index not defined for the current landmark
        {
            continue;
        }
        model_points.emplace_back(current_mesh.vertices[vertex_idx.value()].homogeneous());
        vertex_indices.emplace_back(vertex_idx.value());
        image_points.emplace_back(landmarks[i].coordinates);
    }

    // Need to do an initial pose fit to do the contour fitting inside the loop.
    // We'll do an expression fit too, since face shapes vary quite a lot, depending on expressions.
    fitting::ScaledOrthoProjectionParameters current_pose =
        fitting::estimate_orthographic_projection_linear(image_points, model_points, true, image_height);
    fitting::RenderingParameters rendering_params(current_pose, image_width, image_height);

    const Eigen::Matrix<float, 3, 4> affine_from_ortho =
        fitting::get_3x4_affine_camera_matrix(rendering_params, image_width, image_height);
    expression_coefficients =
        fit_expressions(morphable_model.get_expression_model().value(), current_pca_shape, affine_from_ortho,
                        image_points, vertex_indices, lambda_expressions, num_expression_coefficients_to_fit);

    // Mesh with same PCA coeffs as before, but new expression fit (this is relevant if no initial blendshape coeffs have been given):
    current_combined_shape = current_pca_shape + draw_sample(morphable_model.get_expression_model().value(),
                                                             expression_coefficients);
    current_mesh = morphablemodel::sample_to_mesh(
        current_combined_shape, morphable_model.get_color_model().get_mean(),
        morphable_model.get_shape_model().get_triangle_list(),
        morphable_model.get_color_model().get_triangle_list(), morphable_model.get_texture_coordinates(),
        morphable_model.get_texture_triangle_indices());

    // The static (fixed) landmark correspondences which will stay the same throughout
    // the fitting (the inner face landmarks):
    const auto fixed_image_points = image_points;
    const auto fixed_vertex_indices = vertex_indices;

    for (int i = 0; i < num_iterations; ++i)
    {
        image_points = fixed_image_points;
        vertex_indices = fixed_vertex_indices;
        // Given the current pose, find 2D-3D contour correspondences of the front-facing face contour:
        vector<Vector2f> image_points_contour;
        vector<int> vertex_indices_contour;
        const auto yaw_angle = rendering_params.get_yaw_pitch_roll()[0];
        // For each 2D contour landmark, get the corresponding 3D vertex point and vertex id:
        std::tie(image_points_contour, std::ignore, vertex_indices_contour) =
            fitting::get_contour_correspondences(landmarks, contour_landmarks, model_contour, yaw_angle,
                                                 current_mesh, rendering_params.get_modelview(),
                                                 rendering_params.get_projection(),
                                                 fitting::get_opencv_viewport(image_width, image_height));
        // Add the contour correspondences to the set of landmarks that we use for the fitting:
        vertex_indices = fitting::concat(vertex_indices, vertex_indices_contour);
        image_points = fitting::concat(image_points, image_points_contour);

        // Fit the occluding (away-facing) contour using the detected contour LMs:
        vector<Vector2f> occluding_contour_landmarks;
        if (yaw_angle >= 0.0f) // positive yaw = subject looking to the left
        { // the left contour is the occluding one we want to use ("away-facing")
            const auto contour_landmarks_ =
                core::filter(landmarks, contour_landmarks.left_contour); // Can do this outside of the loop
            std::for_each(begin(contour_landmarks_), end(contour_landmarks_),
                          [&occluding_contour_landmarks](const auto& lm) {
                              occluding_contour_landmarks.push_back({lm.coordinates[0], lm.coordinates[1]});
                          });
        } else
        {
            const auto contour_landmarks_ = core::filter(landmarks, contour_landmarks.right_contour);
            std::for_each(begin(contour_landmarks_), end(contour_landmarks_),
                          [&occluding_contour_landmarks](const auto& lm) {
                              occluding_contour_landmarks.push_back({lm.coordinates[0], lm.coordinates[1]});
                          });
        }
        const auto edge_correspondences = fitting::find_occluding_edge_correspondences(
            current_mesh, edge_topology, rendering_params, occluding_contour_landmarks, 180.0f);
        image_points = fitting::concat(image_points, edge_correspondences.first);
        vertex_indices = fitting::concat(vertex_indices, edge_correspondences.second);

        // Get the model points of the current mesh, for all correspondences that we've got:
        model_points.clear();
        for (auto v : vertex_indices)
        {
            model_points.push_back({current_mesh.vertices[v][0], current_mesh.vertices[v][1],
                                    current_mesh.vertices[v][2], 1.0f});
        }

        // Re-estimate the pose, using all correspondences:
        current_pose =
            fitting::estimate_orthographic_projection_linear(image_points, model_points, true, image_height);
        rendering_params = fitting::RenderingParameters(current_pose, image_width, image_height);

        const Eigen::Matrix<float, 3, 4> affine_from_ortho =
            fitting::get_3x4_affine_camera_matrix(rendering_params, image_width, image_height);

        // Estimate the PCA shape coefficients with the current blendshape coefficients:
        const VectorXf mean_plus_expressions =
            morphable_model.get_shape_model().get_mean() +
            draw_sample(morphable_model.get_expression_model().value(), expression_coefficients);
        pca_shape_coefficients = fitting::fit_shape_to_landmarks_linear(
            morphable_model.get_shape_model(), affine_from_ortho, image_points, vertex_indices,
            mean_plus_expressions, lambda_identity, num_shape_coefficients_to_fit);

        // Estimate the blendshape coefficients with the current PCA model estimate:
        current_pca_shape = morphable_model.get_shape_model().draw_sample(pca_shape_coefficients);
        expression_coefficients = fit_expressions(
            morphable_model.get_expression_model().value(), current_pca_shape, affine_from_ortho,
            image_points, vertex_indices, lambda_expressions, num_expression_coefficients_to_fit);

        current_combined_shape =
            current_pca_shape +
            draw_sample(morphable_model.get_expression_model().value(), expression_coefficients);
        current_mesh = morphablemodel::sample_to_mesh(
            current_combined_shape, morphable_model.get_color_model().get_mean(),
            morphable_model.get_shape_model().get_triangle_list(),
            morphable_model.get_color_model().get_triangle_list(), morphable_model.get_texture_coordinates(),
            morphable_model.get_texture_triangle_indices());
    }

    fitted_image_points = image_points;
    return {current_mesh, rendering_params}; // I think we could also work with a VectorXf face_instance in
                                             // this function instead of a Mesh, but it would convolute the
                                             // code more (i.e. more complicated to access vertices).
}